

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O2

CompoundString *
Js::CompoundString::NewWithCharCapacity(CharCount initialCharCapacity,JavascriptLibrary *library)

{
  bool bVar1;
  CharCount charCapacity;
  uint initialBlockSize;
  CompoundString *pCVar2;
  
  charCapacity = BlockInfo::AlignCharCapacityForAllocation(initialCharCapacity);
  bVar1 = BlockInfo::ShouldAllocateBuffer(charCapacity);
  if (bVar1) {
    pCVar2 = NewWithBufferCharCapacity(charCapacity,library);
    return pCVar2;
  }
  initialBlockSize = Block::SizeFromUsedCharLength(initialCharCapacity);
  pCVar2 = NewWithBlockSize(initialBlockSize,library);
  return pCVar2;
}

Assistant:

CompoundString *CompoundString::NewWithCharCapacity(
        const CharCount initialCharCapacity,
        JavascriptLibrary *const library)
    {
        const CharCount alignedInitialCharCapacity = BlockInfo::AlignCharCapacityForAllocation(initialCharCapacity);
        if(BlockInfo::ShouldAllocateBuffer(alignedInitialCharCapacity))
            return NewWithBufferCharCapacity(alignedInitialCharCapacity, library);
        return NewWithBlockSize(Block::SizeFromUsedCharLength(initialCharCapacity), library);
    }